

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O2

pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> __thiscall
miniros::master::ParameterStorage::findParameter(ParameterStorage *this,Path *name,bool create)

{
  bool bVar1;
  size_t sVar2;
  XmlRpcValue *pXVar3;
  XmlRpcValue *this_00;
  ulong uVar4;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> pVar5;
  string key;
  XmlRpcValue *local_70;
  XmlRpcValue local_60;
  string local_50;
  
  sVar2 = names::Path::size(name);
  if (sVar2 == 0) {
    local_70 = (XmlRpcValue *)0x0;
    pXVar3 = (XmlRpcValue *)0x0;
  }
  else {
    this_00 = &this->m_parameterRoot;
    local_70 = (XmlRpcValue *)0x0;
    uVar4 = 0;
    while( true ) {
      sVar2 = names::Path::size(name);
      if (sVar2 <= uVar4) break;
      names::Path::str_abi_cxx11_(&local_50,name,(int)uVar4);
      bVar1 = XmlRpc::XmlRpcValue::hasMember(this_00,&local_50);
      if (bVar1) {
        pXVar3 = XmlRpc::XmlRpcValue::operator[](this_00,&local_50);
LAB_0027e6a1:
        bVar1 = true;
        local_70 = this_00;
      }
      else {
        if (create) {
          if (this_00->_type != TypeStruct) {
            XmlRpc::XmlRpcValue::Dict();
            XmlRpc::XmlRpcValue::operator=(this_00,&local_60);
            XmlRpc::XmlRpcValue::~XmlRpcValue(&local_60);
          }
          XmlRpc::XmlRpcValue::Dict();
          pXVar3 = XmlRpc::XmlRpcValue::operator[](this_00,&local_50);
          XmlRpc::XmlRpcValue::operator=(pXVar3,&local_60);
          XmlRpc::XmlRpcValue::~XmlRpcValue(&local_60);
          pXVar3 = XmlRpc::XmlRpcValue::operator[](this_00,&local_50);
          goto LAB_0027e6a1;
        }
        bVar1 = false;
        pXVar3 = this_00;
      }
      this_00 = pXVar3;
      ::std::__cxx11::string::~string((string *)&local_50);
      if (!bVar1) break;
      uVar4 = uVar4 + 1;
    }
    sVar2 = names::Path::size(name);
    pXVar3 = (XmlRpcValue *)0x0;
    if (sVar2 == uVar4) {
      pXVar3 = this_00;
    }
  }
  pVar5.second = local_70;
  pVar5.first = pXVar3;
  return pVar5;
}

Assistant:

std::pair<ParameterStorage::RpcValue*, ParameterStorage::RpcValue*> ParameterStorage::findParameter(const names::Path& name, bool create) const
{
  if (name.size() == 0)
    return {};

  RpcValue* current = const_cast<RpcValue*>(&m_parameterRoot);
  RpcValue* parent = nullptr;

  size_t i = 0;
  for (; i < name.size(); i++) {
    std::string key = name.str(i);
    if (current->hasMember(key)) {
      RpcValue* next = &(*current)[key];
      parent = current;
      current = next;
    }
    else if (create) {
      if (current->getType() != RpcValue::TypeStruct)
        *current = RpcValue::Dict();
      // New value. We are making it dict by default.
      // It is ok for final new value to be dict: setParam will override it anyway.
      (*current)[key] = RpcValue::Dict();
      RpcValue* next = &(*current)[key];

      parent = current;
      current = next;
    } else
      break;
  }

  if (i == name.size()) {
    // current contains a pointer to the needed element.
    return {current, parent};
  }
  return {nullptr, parent};
}